

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O0

void Imf_3_2::anon_unknown_0::core_error_handler_cb(exr_const_context_t f,int code,char *msg)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  char *fn;
  char *local_20;
  undefined8 local_18;
  undefined4 local_c;
  undefined8 local_8;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  pcVar2 = getenv("EXR_CHECK_ENABLE_PRINTS");
  if (pcVar2 != (char *)0x0) {
    iVar1 = exr_get_file_name(local_8,&local_20);
    __stream = _stderr;
    if (iVar1 != 0) {
      local_20 = "<error>";
    }
    pcVar2 = local_20;
    uVar3 = exr_get_error_code_as_string(local_c);
    fprintf(__stream,"ERROR \'%s\' (%s): %s\n",pcVar2,uVar3,local_18);
  }
  return;
}

Assistant:

static void
core_error_handler_cb (exr_const_context_t f, int code, const char* msg)
{
    if (getenv ("EXR_CHECK_ENABLE_PRINTS") != NULL)
    {
        const char* fn;
        if (EXR_ERR_SUCCESS != exr_get_file_name (f, &fn)) fn = "<error>";
        fprintf (
            stderr,
            "ERROR '%s' (%s): %s\n",
            fn,
            exr_get_error_code_as_string (code),
            msg);
    }
}